

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::ScanLineInputFile::ScanLineInputFile(ScanLineInputFile *this,InputPartData *part)

{
  ScanLineInputFile *local_20;
  
  std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)&part->context);
  local_20 = this;
  std::make_shared<Imf_3_4::ScanLineInputFile::Data,Imf_3_4::Context*,int&,int&>
            ((Context **)&this->_data,(int *)&local_20,&part->partNumber);
  Data::initialize((this->_data).
                   super___shared_ptr<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
  return;
}

Assistant:

ScanLineInputFile::ScanLineInputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->partNumber, part->numThreads))
{
    _data->initialize ();
}